

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::LzmaEnc_Construct(CLzmaEnc *p)

{
  CLzmaEncProps props;
  CLzmaEncProps local_38;
  
  (p->rc).bufBase = (Byte *)0x0;
  (p->rc).outStream = (ISeqOutStream *)0x0;
  MatchFinder_Construct(&p->matchFinderBase);
  local_38.level = 5;
  local_38.dictSize = 0;
  local_38.mc = 0;
  local_38.lc = -1;
  local_38.lp = -1;
  local_38.pb = -1;
  local_38.algo = -1;
  local_38.fb = -1;
  local_38.btMode = -1;
  local_38.numHashBytes = -1;
  local_38.writeEndMark = 0;
  local_38.numThreads = -1;
  LzmaEnc_SetProps(p,&local_38);
  LzmaEnc_FastPosInit(p->g_FastPos);
  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = (UInt16 *)0x0;
  (p->saveState).litProbs = (UInt16 *)0x0;
  return;
}

Assistant:

void LzmaEnc_Construct(CLzmaEnc* p) {
  RangeEnc_Construct(&p->rc);
  MatchFinder_Construct(&p->matchFinderBase);
#ifdef COMPRESS_MF_MT
  MatchFinderMt_Construct(&p->matchFinderMt);
  p->matchFinderMt.MatchFinder = &p->matchFinderBase;
#endif

  {
    CLzmaEncProps props;
    LzmaEncProps_Init(&props);
    LzmaEnc_SetProps(p, &props);
  }

#ifndef LZMA_LOG_BSR
  LzmaEnc_FastPosInit(p->g_FastPos);
#endif

  LzmaEnc_InitPriceTables(p->ProbPrices);
  p->litProbs = 0;
  p->saveState.litProbs = 0;
}